

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O2

void __thiscall ymfm::ym2608::write_data_hi(ym2608 *this,uint8_t data)

{
  ushort uVar1;
  ymfm_interface *pyVar2;
  size_t in_RCX;
  
  uVar1 = this->m_address;
  if ((uVar1 >> 8 & 1) == 0) {
    return;
  }
  if (uVar1 < 0x110) {
    adpcm_b_engine::write(&this->m_adpcm_b,uVar1 & 0xf,(void *)(ulong)data,in_RCX);
  }
  else if (uVar1 == 0x110) {
    if ((char)data < '\0') {
      (this->m_fm).m_status = '\0';
    }
    else {
      this->m_flag_control = data;
      (this->m_fm).m_irq_mask = ~data & this->m_irq_enable & 0x1f;
    }
    (*(code *)((this->m_fm).m_intf)->m_engine[1]._vptr_ymfm_engine_callbacks)();
  }
  else {
    fm_engine_base<ymfm::opn_registers_base<true>_>::write
              ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,(uint)uVar1,
               (void *)(ulong)data,in_RCX);
  }
  pyVar2 = (this->m_fm).m_intf;
  (*(code *)pyVar2->m_engine[3]._vptr_ymfm_engine_callbacks)
            (pyVar2,(ulong)(this->m_fm).m_clock_prescale << 5);
  return;
}

Assistant:

void ym2608::write_data_hi(uint8_t data)
{
	// ignore if paired with upper address
	if (!bitfield(m_address, 8))
		return;

	if (m_address < 0x110)
	{
		// 100-10F: write to ADPCM-B
		m_adpcm_b.write(m_address & 0x0f, data);
	}
	else if (m_address == 0x110)
	{
		// 110: IRQ flag control
		if (bitfield(data, 7))
			m_fm.set_reset_status(0, 0xff);
		else
		{
			m_flag_control = data;
			m_fm.set_irq_mask(m_irq_enable & ~m_flag_control & 0x1f);
		}
	}
	else
	{
		// 111-1FF: write to FM
		m_fm.write(m_address, data);
	}

	// mark busy for a bit
	m_fm.intf().ymfm_set_busy_end(32 * m_fm.clock_prescale());
}